

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O3

int expand_rule(jsgf_t *grammar,jsgf_rule_t *rule)

{
  jsgf_rhs_t *pjVar1;
  char *__s1;
  jsgf_rule_t *pjVar2;
  int iVar3;
  int32 iVar4;
  gnode_t *pgVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  glist_t pgVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  glist_t pgVar13;
  uint uVar14;
  jsgf_rhs_t *pjVar15;
  float fVar16;
  uint local_64;
  jsgf_rule_t *local_50;
  undefined1 local_48 [16];
  
  pgVar5 = glist_add_ptr(grammar->rulestack,rule);
  grammar->rulestack = pgVar5;
  fVar16 = 0.0;
  pjVar15 = rule->rhs;
  for (pjVar1 = pjVar15; pjVar1 != (jsgf_rhs_t *)0x0; pjVar1 = pjVar1->alt) {
    if (pjVar1->atoms != (glist_t)0x0) {
      fVar16 = fVar16 + *(float *)((pjVar1->atoms->data).i + 0x10);
    }
  }
  iVar3 = grammar->nstate;
  rule->entry = iVar3;
  grammar->nstate = iVar3 + 2;
  rule->exit = iVar3 + 1;
  if (pjVar15 != (jsgf_rhs_t *)0x0) {
    local_48 = ZEXT416(~-(uint)(fVar16 == 0.0) & (uint)fVar16 | -(uint)(fVar16 == 0.0) & 0x3f800000)
    ;
    do {
      pgVar13 = pjVar15->atoms;
      if (pgVar13 == (glist_t)0x0) {
        local_64 = rule->entry;
      }
      else {
        *(float *)((pgVar13->data).i + 0x10) =
             *(float *)((pgVar13->data).i + 0x10) / (float)local_48._0_4_;
        uVar14 = rule->entry;
        do {
          puVar12 = (undefined8 *)(pgVar13->data).ptr;
          __s1 = (char *)*puVar12;
          if ((*__s1 == '<') && (iVar3 = strcmp(__s1,"<NULL>"), iVar3 != 0)) {
            iVar3 = strcmp(__s1,"<VOID>");
            local_64 = 0xffffffff;
            if (iVar3 == 0) break;
            pcVar6 = strchr(__s1 + 1,0x2e);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = __ckd_salloc__(rule->name + 1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                      ,0xcc);
              pcVar9 = strrchr(pcVar6 + 1,0x2e);
              if (pcVar9 == (char *)0x0) {
                ckd_free(pcVar6);
LAB_00131164:
                iVar3 = 0xf5;
                goto LAB_00131173;
              }
              *pcVar9 = '\0';
              if (pcVar6 == (char *)0x0) goto LAB_00131164;
              sVar7 = strlen(pcVar6);
              sVar8 = strlen(__s1);
              pcVar9 = (char *)__ckd_malloc__(sVar7 + sVar8 + 4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                              ,0xf6);
              sprintf(pcVar9,"<%s.%s",pcVar6,__s1 + 1);
              ckd_free(pcVar6);
            }
            else {
              iVar3 = 0xf1;
LAB_00131173:
              pcVar9 = __ckd_salloc__(__s1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                      ,iVar3);
            }
            iVar4 = hash_table_lookup(grammar->rules,pcVar9,&local_50);
            if (iVar4 == -1) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                      ,0x13e,"Undefined rule in RHS: %s\n",pcVar9);
              ckd_free(pcVar9);
              break;
            }
            ckd_free(pcVar9);
            pjVar2 = local_50;
            for (pgVar10 = grammar->rulestack; pgVar10 != (glist_t)0x0; pgVar10 = pgVar10->next) {
              if ((jsgf_rule_t *)(pgVar10->data).ptr == local_50) {
                if (pgVar13->next == (gnode_s *)0x0) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x155,"Right recursion %s %d => %d\n",*puVar12,(ulong)uVar14,
                          local_50->entry);
                  iVar3 = pjVar2->entry;
                  puVar11 = (undefined8 *)
                            __ckd_calloc__(1,0x10,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                           ,0xc1);
                  *(uint *)(puVar11 + 1) = uVar14;
                  *(int *)((long)puVar11 + 0xc) = iVar3;
                  *puVar11 = puVar12;
                  pgVar13 = glist_add_ptr(grammar->links,puVar11);
                  grammar->links = pgVar13;
                  local_64 = 0xfffffffe;
                }
                else {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x150,"Only right-recursion is permitted (in %s.%s)\n",grammar->name,
                          rule->name);
                }
                goto LAB_001312fc;
              }
            }
            iVar3 = expand_rule(grammar,local_50);
            if (iVar3 == -1) break;
            iVar3 = pjVar2->entry;
            puVar11 = (undefined8 *)
                      __ckd_calloc__(1,0x10,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                     ,0xc1);
            *(uint *)(puVar11 + 1) = uVar14;
            *(int *)((long)puVar11 + 0xc) = iVar3;
            *puVar11 = puVar12;
            pgVar10 = glist_add_ptr(grammar->links,puVar11);
            grammar->links = pgVar10;
            uVar14 = pjVar2->exit;
          }
          else {
            iVar3 = grammar->nstate;
            puVar11 = (undefined8 *)
                      __ckd_calloc__(1,0x10,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                     ,0xc1);
            *(uint *)(puVar11 + 1) = uVar14;
            *(int *)((long)puVar11 + 0xc) = iVar3;
            *puVar11 = puVar12;
            pgVar10 = glist_add_ptr(grammar->links,puVar11);
            grammar->links = pgVar10;
            uVar14 = grammar->nstate;
            grammar->nstate = uVar14 + 1;
          }
          pgVar13 = pgVar13->next;
          local_64 = uVar14;
        } while (pgVar13 != (gnode_s *)0x0);
      }
LAB_001312fc:
      if (local_64 != 0xfffffffe) {
        if (local_64 == 0xffffffff) {
          return -1;
        }
        iVar3 = rule->exit;
        puVar12 = (undefined8 *)
                  __ckd_calloc__(1,0x10,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                 ,0xc1);
        *(uint *)(puVar12 + 1) = local_64;
        *(int *)((long)puVar12 + 0xc) = iVar3;
        *puVar12 = 0;
        pgVar13 = glist_add_ptr(grammar->links,puVar12);
        grammar->links = pgVar13;
      }
      pjVar15 = pjVar15->alt;
    } while (pjVar15 != (jsgf_rhs_t *)0x0);
    pgVar5 = grammar->rulestack;
  }
  pgVar5 = gnode_free(pgVar5,(gnode_t *)0x0);
  grammar->rulestack = pgVar5;
  return rule->exit;
}

Assistant:

static int
expand_rule(jsgf_t * grammar, jsgf_rule_t * rule)
{
    jsgf_rhs_t *rhs;
    float norm;

    /* Push this rule onto the stack */
    grammar->rulestack = glist_add_ptr(grammar->rulestack, rule);

    /* Normalize weights for all alternatives exiting rule->entry */
    norm = 0;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
            norm += atom->weight;
        }
    }

    rule->entry = grammar->nstate++;
    rule->exit = grammar->nstate++;
    if (norm == 0) norm = 1;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        int lastnode;

        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
	    atom->weight /= norm;
        }
        lastnode = expand_rhs(grammar, rule, rhs);
        if (lastnode == -1) {
            return -1;
        }
        else if (lastnode == RECURSION) {
            /* Do nothing. */
        }
        else {
            jsgf_add_link(grammar, NULL, lastnode, rule->exit);
        }
    }

    /* Pop this rule from the rule stack */
    grammar->rulestack = gnode_free(grammar->rulestack, NULL);
    return rule->exit;
}